

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void VW::empty_example(vw *param_1,example *ec)

{
  bool bVar1;
  long in_RSI;
  features *fs;
  iterator __end1;
  iterator __begin1;
  example *__range1;
  example_predict *in_stack_ffffffffffffffc0;
  iterator local_38;
  iterator local_28;
  long local_10;
  
  local_10 = in_RSI;
  local_28 = example_predict::begin(in_stack_ffffffffffffffc0);
  local_38 = example_predict::end(in_stack_ffffffffffffffc0);
  while( true ) {
    bVar1 = example_predict::iterator::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    in_stack_ffffffffffffffc0 = (example_predict *)example_predict::iterator::operator*(&local_28);
    features::clear((features *)in_stack_ffffffffffffffc0);
    example_predict::iterator::operator++(&local_28);
  }
  v_array<unsigned_char>::clear(&in_stack_ffffffffffffffc0->indices);
  v_array<char>::clear((v_array<char> *)in_stack_ffffffffffffffc0);
  *(undefined1 *)(local_10 + 0x68ca) = 0;
  *(undefined1 *)(local_10 + 0x68c9) = 0;
  return;
}

Assistant:

void empty_example(vw& /* all */, example& ec)
{
  for (features& fs : ec) fs.clear();

  ec.indices.clear();
  ec.tag.clear();
  ec.sorted = false;
  ec.end_pass = false;
}